

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DoSimpleFilter_SSE2(__m128i *p0,__m128i *q0,__m128i *fl)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  __m128i v4;
  __m128i v3;
  __m128i k4;
  __m128i k3;
  __m128i local_128;
  __m128i local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 (*local_e0) [16];
  undefined1 (*local_d8) [16];
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_c9 = 3;
  local_a9 = 3;
  local_aa = 3;
  local_ab = 3;
  local_ac = 3;
  local_ad = 3;
  local_ae = 3;
  local_af = 3;
  local_b0 = 3;
  local_b1 = 3;
  local_b2 = 3;
  local_b3 = 3;
  local_b4 = 3;
  local_b5 = 3;
  local_b6 = 3;
  local_b7 = 3;
  local_b8 = 3;
  local_f8 = 0x303030303030303;
  uStack_f0 = 0x303030303030303;
  local_ca = 4;
  local_89 = 4;
  local_8a = 4;
  local_8b = 4;
  local_8c = 4;
  local_8d = 4;
  local_8e = 4;
  local_8f = 4;
  local_90 = 4;
  local_91 = 4;
  local_92 = 4;
  local_93 = 4;
  local_94 = 4;
  local_95 = 4;
  local_96 = 4;
  local_97 = 4;
  local_98 = 4;
  local_108 = 0x404040404040404;
  uStack_100 = 0x404040404040404;
  local_18 = *(undefined8 *)*in_RDX;
  uStack_10 = *(undefined8 *)(*in_RDX + 8);
  auVar1._8_8_ = 0x303030303030303;
  auVar1._0_8_ = 0x303030303030303;
  local_118 = (__m128i)paddsb(*in_RDX,auVar1);
  local_38 = *(undefined8 *)*in_RDX;
  uStack_30 = *(undefined8 *)(*in_RDX + 8);
  auVar2._8_8_ = 0x404040404040404;
  auVar2._0_8_ = 0x404040404040404;
  local_128 = (__m128i)paddsb(*in_RDX,auVar2);
  local_e0 = in_RSI;
  local_d8 = in_RDI;
  local_c8 = local_f8;
  uStack_c0 = uStack_f0;
  local_a8 = local_108;
  uStack_a0 = uStack_100;
  local_48 = local_108;
  uStack_40 = uStack_100;
  local_28 = local_f8;
  uStack_20 = uStack_f0;
  SignedShift8b_SSE2(&local_128);
  SignedShift8b_SSE2(&local_118);
  auVar2 = psubsb(*local_e0,(undefined1  [16])local_128);
  *local_e0 = auVar2;
  auVar2 = paddsb(*local_d8,(undefined1  [16])local_118);
  *local_d8 = auVar2;
  return;
}

Assistant:

static WEBP_INLINE void DoSimpleFilter_SSE2(__m128i* const p0,
                                            __m128i* const q0,
                                            const __m128i* const fl) {
  const __m128i k3 = _mm_set1_epi8(3);
  const __m128i k4 = _mm_set1_epi8(4);
  __m128i v3 = _mm_adds_epi8(*fl, k3);
  __m128i v4 = _mm_adds_epi8(*fl, k4);

  SignedShift8b_SSE2(&v4);             // v4 >> 3
  SignedShift8b_SSE2(&v3);             // v3 >> 3
  *q0 = _mm_subs_epi8(*q0, v4);        // q0 -= v4
  *p0 = _mm_adds_epi8(*p0, v3);        // p0 += v3
}